

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
          (gemm_pack_rhs<double,_long,_4,_1,_false,_false> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  long local_80;
  long k_1;
  double *b0_1;
  long j2_1;
  double *b0;
  long k;
  long j2;
  long count;
  long packet_cols;
  long lStack_38;
  conj_if<false> cj;
  long cols_local;
  long depth_local;
  long rhsStride_local;
  double *rhs_local;
  double *blockB_local;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> *this_local;
  
  lStack_38 = cols;
  ignore_unused_variable<long>(&stride);
  ignore_unused_variable<long>(&offset);
  if ((stride != 0) || (bVar1 = true, offset != 0)) {
    bVar1 = false;
  }
  if (bVar1) {
    b0_1 = (double *)(lStack_38 / 4 << 2);
    j2 = 0;
    for (k = 0; k < (long)b0_1; k = k + 4) {
      for (b0 = (double *)0x0; (long)b0 < depth; b0 = (double *)((long)b0 + 1)) {
        pdVar3 = rhs + (long)b0 * rhsStride + k;
        pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols + 7),pdVar3);
        blockB[j2] = *pdVar2;
        pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols + 7),pdVar3 + 1);
        blockB[j2 + 1] = *pdVar2;
        pdVar2 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols + 7),pdVar3 + 2);
        blockB[j2 + 2] = *pdVar2;
        pdVar3 = conj_if<false>::operator()((conj_if<false> *)((long)&packet_cols + 7),pdVar3 + 3);
        blockB[j2 + 3] = *pdVar3;
        j2 = j2 + 4;
      }
    }
    for (; (long)b0_1 < lStack_38; b0_1 = (double *)((long)b0_1 + 1)) {
      for (local_80 = 0; local_80 < depth; local_80 = local_80 + 1) {
        pdVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&packet_cols + 7),
                            rhs + (long)((long)b0_1 + local_80 * rhsStride));
        blockB[j2] = *pdVar3;
        j2 = j2 + 1;
      }
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x4fb,
                "void Eigen::internal::gemm_pack_rhs<double, long, 4, 1>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    for(Index k=0; k<depth; k++)
    {
      const Scalar* b0 = &rhs[k*rhsStride + j2];
                blockB[count+0] = cj(b0[0]);
                blockB[count+1] = cj(b0[1]);
      if(nr==4) blockB[count+2] = cj(b0[2]);
      if(nr==4) blockB[count+3] = cj(b0[3]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[j2];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k*rhsStride]);
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}